

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lz4.c
# Opt level: O3

int archive_read_support_filter_lz4(archive *_a)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_read_register_bidder((archive_read *)_a,(void *)0x0,"lz4",&lz4_bidder_vtable);
  iVar2 = -0x1e;
  if (iVar1 == 0) {
    archive_set_error(_a,-1,"Using external lz4 program");
    iVar2 = -0x14;
  }
  return iVar2;
}

Assistant:

int
archive_read_support_filter_lz4(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, "lz4",
				&lz4_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

#if defined(HAVE_LIBLZ4)
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lz4 program");
	return (ARCHIVE_WARN);
#endif
}